

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O2

UBool isFollowedByCasedLetter(UCaseContextIterator *iter,void *context,int8_t dir)

{
  UChar32 c;
  uint uVar1;
  
  if (iter == (UCaseContextIterator *)0x0) {
    return '\0';
  }
  do {
    c = (*iter)(context,dir);
    if (c < 0) {
      return '\0';
    }
    uVar1 = ucase_getTypeOrIgnorable_63(c);
    dir = '\0';
  } while (3 < uVar1);
  return uVar1 != 0;
}

Assistant:

static UBool
isFollowedByCasedLetter(UCaseContextIterator *iter, void *context, int8_t dir) {
    UChar32 c;

    if(iter==NULL) {
        return FALSE;
    }

    for(/* dir!=0 sets direction */; (c=iter(context, dir))>=0; dir=0) {
        int32_t type=ucase_getTypeOrIgnorable(c);
        if(type&4) {
            /* case-ignorable, continue with the loop */
        } else if(type!=UCASE_NONE) {
            return TRUE; /* followed by cased letter */
        } else {
            return FALSE; /* uncased and not case-ignorable */
        }
    }

    return FALSE; /* not followed by cased letter */
}